

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance>::
~QueryPoolStatisticsTest
          (QueryPoolStatisticsTest<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance>
           *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolStatisticsTest_00d2a5d8;
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  ::~vector(&this->m_parameters);
  tcu::TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

QueryPoolStatisticsTest (tcu::TestContext &context, const char *name, const char *description)
		: TestCase			(context, name, description)
	{
		const tcu::UVec3	localSize[]		=
		{
			tcu::UVec3	(2u,			2u,	2u),
			tcu::UVec3	(1u,			1u,	1u),
			tcu::UVec3	(WIDTH/(7u*3u),	7u,	3u),
		};

		const tcu::UVec3	groupSize[]		=
		{
			tcu::UVec3	(2u,			2u,	2u),
			tcu::UVec3	(WIDTH/(7u*3u),	7u,	3u),
			tcu::UVec3	(1u,			1u,	1u),
		};

		DE_ASSERT(DE_LENGTH_OF_ARRAY(localSize) == DE_LENGTH_OF_ARRAY(groupSize));

		for(int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(localSize); ++shaderNdx)
		{
			std::ostringstream	shaderName;
			shaderName<< "compute_" << shaderNdx;
			const ComputeInvocationsTestInstance::ParametersCompute	prameters	=
			{
				localSize[shaderNdx],
				groupSize[shaderNdx],
				shaderName.str(),
			};
			m_parameters.push_back(prameters);
		}
	}